

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::OptionParseException::~OptionParseException(OptionParseException *this)

{
  OptionException::~OptionException(&this->super_OptionException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit OptionParseException(const std::string& message)
    : OptionException(message)
    {
    }